

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtextstream_p.cpp
# Opt level: O0

void QDeviceClosedNotifier::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  int in_EDX;
  int in_ESI;
  QDeviceClosedNotifier *_t;
  
  if ((in_ESI == 0) && (in_EDX == 0)) {
    flushStream((QDeviceClosedNotifier *)0x4addef);
  }
  return;
}

Assistant:

void QDeviceClosedNotifier::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDeviceClosedNotifier *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->flushStream(); break;
        default: ;
        }
    }
    (void)_a;
}